

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_pushdown.cpp
# Opt level: O3

bool duckdb::LimitPushdown::CanOptimize(LogicalOperator *op)

{
  reference this;
  pointer pLVar1;
  LogicalLimit *pLVar2;
  idx_t iVar3;
  
  if (op->type == LOGICAL_LIMIT) {
    this = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](&op->children,0);
    pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(this);
    if (pLVar1->type != LOGICAL_PROJECTION) {
      return false;
    }
    pLVar2 = LogicalOperator::Cast<duckdb::LogicalLimit>(op);
    if ((1 < (byte)((pLVar2->offset_val).type - EXPRESSION_VALUE)) &&
       ((pLVar2->limit_val).type == CONSTANT_VALUE)) {
      iVar3 = BoundLimitNode::GetConstantValue(&pLVar2->limit_val);
      return iVar3 < 0x2000;
    }
  }
  return false;
}

Assistant:

bool LimitPushdown::CanOptimize(duckdb::LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_LIMIT &&
	    op.children[0]->type == LogicalOperatorType::LOGICAL_PROJECTION) {
		auto &limit = op.Cast<LogicalLimit>();

		if (limit.offset_val.Type() == LimitNodeType::EXPRESSION_PERCENTAGE ||
		    limit.offset_val.Type() == LimitNodeType::EXPRESSION_VALUE) {
			// Offset cannot be an expression
			return false;
		}

		if (limit.limit_val.Type() == LimitNodeType::CONSTANT_VALUE && limit.limit_val.GetConstantValue() < 8192) {
			// Push down only when limit value is smaller than 8192.
			// when physical_limit is introduced, it will end a parallel pipeline
			// restrict the limit value to be small so that remaining operations run fast without parallelization.
			return true;
		}
	}
	return false;
}